

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleVariableTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_2::SampleIDCase::init(SampleIDCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *poVar1;
  int iVar2;
  undefined1 local_190 [120];
  ios_base local_118 [264];
  
  if (this->m_vericationMode == VERIFY_USING_SELECTION) {
    local_190._0_8_ =
         ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
          super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_190 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Selecting a single sample id for each pixel and writing color only if gl_SampleID == selected.\n"
               ,0x5f);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Expecting all output pixels to be partially (multisample) or fully (singlesample) colored.\n"
               ,0x5b);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    if (this->m_vericationMode != VERIFY_USING_SAMPLES) goto LAB_014414fc;
    local_190._0_8_ =
         ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
          super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_190 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Writing gl_SampleID to the green channel of the texture and verifying texture values, expecting:\n"
               ,0x61);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"\t1) 0 with non-multisample targets.\n",0x24);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"\t2) value N at sample index N of a multisample texture\n",0x37);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  ctx = (EVP_PKEY_CTX *)&std::__cxx11::ostringstream::VTT;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_190 + 8));
  std::ios_base::~ios_base(local_118);
LAB_014414fc:
  iVar2 = MultisampleRenderCase::init(&this->super_MultisampleRenderCase,ctx);
  return iVar2;
}

Assistant:

void SampleIDCase::init (void)
{
	// log the test method and expectations
	if (m_vericationMode == VERIFY_USING_SAMPLES)
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Writing gl_SampleID to the green channel of the texture and verifying texture values, expecting:\n"
			<< "	1) 0 with non-multisample targets.\n"
			<< "	2) value N at sample index N of a multisample texture\n"
			<< tcu::TestLog::EndMessage;
	else if (m_vericationMode == VERIFY_USING_SELECTION)
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Selecting a single sample id for each pixel and writing color only if gl_SampleID == selected.\n"
			<< "Expecting all output pixels to be partially (multisample) or fully (singlesample) colored.\n"
			<< tcu::TestLog::EndMessage;
	else
		DE_ASSERT(false);

	MultisampleRenderCase::init();
}